

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zt_ipv4_tbl.c
# Opt level: O2

zt_ipv4_node * zt_ipv4_tbl_search_from_str(zt_ipv4_tbl *tbl,char *netstr)

{
  zt_ipv4_node *pzVar1;
  zt_ipv4_node *local_10;
  
  if ((netstr != (char *)0x0 && tbl != (zt_ipv4_tbl *)0x0) &&
     (local_10 = zt_ipv4_node_str_init(netstr), local_10 != (zt_ipv4_node *)0x0)) {
    pzVar1 = zt_ipv4_tbl_search_node(tbl,local_10);
    zt_mem_pool_release(&local_10);
    return pzVar1;
  }
  return (zt_ipv4_node *)0x0;
}

Assistant:

zt_ipv4_node   *
zt_ipv4_tbl_search_from_str(zt_ipv4_tbl * tbl, const char *netstr)
{
    zt_ipv4_node *ipv4_node = NULL;
    zt_ipv4_node *matched = NULL;

    if (!tbl || !netstr) {
        return NULL;
    }

    if (!(ipv4_node = zt_ipv4_node_str_init(netstr))) {
        return NULL;
    }

    matched = zt_ipv4_tbl_search_node(tbl, ipv4_node);

    zt_mem_pool_release((void **)&ipv4_node);

    return matched;
}